

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageBase.cpp
# Opt level: O0

void processLevel(string *s)

{
  bool bVar1;
  __type_conflict2 _Var2;
  int iVar3;
  level_enum lVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  mapped_type *pmVar6;
  string *in_RDI;
  level_enum get_level_enum_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *monitor;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  monitors;
  bool valid_monitor;
  string level_name;
  string monitor_name;
  size_t split_index;
  level_enum get_level_enum;
  char *ch;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  string local_150 [8];
  key_type *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  string local_128 [32];
  string local_108 [32];
  reference local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  undefined1 *local_d0;
  undefined1 local_c8 [31];
  byte local_a9;
  string local_a8 [32];
  string local_88 [32];
  long local_68;
  string local_50 [36];
  level_enum local_2c;
  reference local_28;
  undefined8 local_20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18 [3];
  
  local_18[0]._M_current = (char *)std::__cxx11::string::begin();
  local_20 = std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffe78), bVar1) {
    local_28 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(local_18);
    iVar3 = tolower((int)*local_28);
    *local_28 = (char)iVar3;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_18);
  }
  lVar5 = std::__cxx11::string::find((char)in_RDI,0x3a);
  if (lVar5 == -1) {
    local_2c = spdlog::level::from_str(in_RDI);
    if (local_2c == off) {
      std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      spdlog::error<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3183e1);
      std::__cxx11::string::~string(local_50);
      invalid_level_option = true;
      local_2c = global_logging_level;
    }
  }
  else {
    this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
    local_68 = std::__cxx11::string::find((char)in_RDI,0x3a);
    std::__cxx11::string::substr((ulong)local_88,(ulong)in_RDI);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_68 + 1);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_a8,(ulong)in_RDI);
    local_a9 = 0;
    prmon::get_all_registered_abi_cxx11_();
    local_d0 = local_c8;
    local_d8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffe78);
    local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(in_stack_fffffffffffffe78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffe78), bVar1) {
      local_e8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_d8);
      _Var2 = std::operator==(in_stack_fffffffffffffea0,__rhs);
      if (_Var2) {
        local_a9 = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_d8);
    }
    if ((local_a9 & 1) == 0) {
      std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      std::operator+(in_stack_fffffffffffffe88,
                     (char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      spdlog::error<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3185f1);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      invalid_level_option = true;
    }
    else {
      lVar4 = spdlog::level::from_str(in_RDI);
      if (lVar4 == off) {
        std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        spdlog::error<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3186ba);
        std::__cxx11::string::~string(local_150);
        invalid_level_option = true;
      }
      else {
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
                               *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        *pmVar6 = lVar4;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_88);
    local_2c = global_logging_level;
  }
  global_logging_level = local_2c;
  return;
}

Assistant:

void processLevel(std::string s) {
  for (auto& ch : s) {
    ch = std::tolower(ch);
  }
  if (s.find(':') == std::string::npos) {
    // No ':' in option -> set global level
    spdlog::level::level_enum get_level_enum = spdlog::level::from_str(s);
    if (get_level_enum == 6) {
      // Invalid name
      spdlog::error("Invalid level name " + s);
      invalid_level_option = true;
    } else
      global_logging_level = get_level_enum;
  } else {
    size_t split_index = s.find(':');
    std::string monitor_name = s.substr(0, split_index);
    std::string level_name =
        s.substr(split_index + 1, s.size() - (split_index + 1));

    // Check validity of monitor name
    bool valid_monitor = false;
    auto monitors = prmon::get_all_registered();
    for (const auto& monitor : monitors) {
      if (monitor == monitor_name) {
        valid_monitor = true;
        break;
      }
    }
    if (!valid_monitor) {
      spdlog::error("Invalid monitor name " + monitor_name +
                    " for logging level");
      invalid_level_option = true;
      return;
    }
    // Check validity of level name
    spdlog::level::level_enum get_level_enum =
        spdlog::level::from_str(level_name);
    if (get_level_enum == 6) {
      // Invalid name
      spdlog::error("Invalid level name " + level_name);
      invalid_level_option = true;
      return;
    }

    monitor_level[monitor_name] = get_level_enum;
  }
}